

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_negation_range
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  bool bVar1;
  run_container_t *prVar2;
  container_t *pcVar3;
  int local_3c;
  int k;
  run_container_t *ans;
  container_t **ppcStack_28;
  uint8_t return_typecode;
  container_t **dst_local;
  int range_end_local;
  int range_start_local;
  run_container_t *src_local;
  
  ppcStack_28 = dst;
  dst_local._0_4_ = range_end;
  dst_local._4_4_ = range_start;
  _range_end_local = src;
  if (range_start < range_end) {
    prVar2 = run_container_create_given_capacity(src->n_runs + 1);
    local_3c = 0;
    while( true ) {
      bVar1 = false;
      if (local_3c < _range_end_local->n_runs) {
        bVar1 = (int)(uint)_range_end_local->runs[local_3c].value < dst_local._4_4_;
      }
      if (!bVar1) break;
      prVar2->runs[local_3c] = _range_end_local->runs[local_3c];
      prVar2->n_runs = prVar2->n_runs + 1;
      local_3c = local_3c + 1;
    }
    run_container_smart_append_exclusive
              (prVar2,(uint16_t)dst_local._4_4_,
               ((short)(int)dst_local - (uint16_t)dst_local._4_4_) - 1);
    for (; local_3c < _range_end_local->n_runs; local_3c = local_3c + 1) {
      run_container_smart_append_exclusive
                (prVar2,_range_end_local->runs[local_3c].value,
                 _range_end_local->runs[local_3c].length);
    }
    pcVar3 = convert_run_to_efficient_container(prVar2,(uint8_t *)((long)&ans + 7));
    *ppcStack_28 = pcVar3;
    if (ans._7_1_ != 3) {
      run_container_free(prVar2);
    }
    src_local._4_4_ = (uint)ans._7_1_;
  }
  else {
    prVar2 = run_container_clone(src);
    *ppcStack_28 = prVar2;
    src_local._4_4_ = 3;
  }
  return src_local._4_4_;
}

Assistant:

int run_container_negation_range(
    const run_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    uint8_t return_typecode;

    // follows the Java implementation
    if (range_end <= range_start) {
        *dst = run_container_clone(src);
        return RUN_CONTAINER_TYPE;
    }

    run_container_t *ans = run_container_create_given_capacity(
        src->n_runs + 1);  // src->n_runs + 1);
    int k = 0;
    for (; k < src->n_runs && src->runs[k].value < range_start; ++k) {
        ans->runs[k] = src->runs[k];
        ans->n_runs++;
    }

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < src->n_runs; ++k) {
        run_container_smart_append_exclusive(ans, src->runs[k].value,
                                             src->runs[k].length);
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}